

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.cc
# Opt level: O1

int __thiscall rcg::System::open(System *this,char *__file,int __oflag,...)

{
  int iVar1;
  GC_ERROR GVar2;
  GenTLException *this_00;
  string local_48;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->mtx);
  if (iVar1 == 0) {
    if (this->n_open == 0) {
      GVar2 = (*((this->gentl).
                 super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                TLOpen)(&this->tl);
      if (GVar2 != 0) goto LAB_00109f10;
    }
    this->n_open = this->n_open + 1;
    iVar1 = pthread_mutex_unlock((pthread_mutex_t *)&this->mtx);
    return iVar1;
  }
  std::__throw_system_error(iVar1);
LAB_00109f10:
  this_00 = (GenTLException *)__cxa_allocate_exception(0x28);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"System::open()","");
  GenTLException::GenTLException(this_00,&local_48,&this->gentl);
  __cxa_throw(this_00,&GenTLException::typeinfo,GenTLException::~GenTLException);
}

Assistant:

void System::open()
{
  std::lock_guard<std::recursive_mutex> lock(mtx);

  if (n_open == 0)
  {
    if (gentl->TLOpen(&tl) != GenTL::GC_ERR_SUCCESS)
    {
      throw GenTLException("System::open()", gentl);
    }
  }

  n_open++;
}